

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<Finite> __thiscall Matrix<Finite>::operator/(Matrix<Finite> *this,Finite *a)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  Finite *extraout_RDX;
  ulong uVar1;
  long lVar2;
  Matrix<Finite> MVar3;
  Matrix<Finite> temp;
  Matrix<Finite> local_90;
  Finite local_80;
  Finite local_60;
  Finite local_40;
  
  Matrix(&local_90,(Matrix<Finite> *)a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,in_RDX);
  local_80.val.negative =
       *(bool *)&in_RDX[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  Finite::Finite(&local_40,1);
  Finite::operator/(&local_60,&local_40,&local_80);
  if (local_90.M * local_90.N != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      Finite::operator*=((Finite *)
                         ((long)&((local_90.arr)->val).digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar2),&local_60);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar1 < local_90.M * local_90.N);
  }
  if (local_60.val.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.val.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.val.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.val.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Matrix(this,&local_90);
  if (local_80.val.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.val.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ~Matrix(&local_90);
  MVar3.arr = extraout_RDX;
  MVar3._0_8_ = this;
  return MVar3;
}

Assistant:

inline const Matrix operator/(Field a) const
    {
        Matrix temp(*this);
        return temp /= a;
    }